

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gogoing_util.cpp
# Opt level: O0

void going_set_off_tcp_cork(int sockfd)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *local_28;
  undefined4 local_10;
  int ret;
  int off;
  int sockfd_local;
  
  local_10 = 0;
  ret = sockfd;
  iVar1 = setsockopt(sockfd,6,3,&local_10,4);
  __stream = _stderr;
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    if (*piVar2 == 0) {
      local_28 = "None";
    }
    else {
      piVar2 = __errno_location();
      local_28 = strerror(*piVar2);
    }
    fprintf(__stream,"[ERROR] (%s:%d: errno: %s) setsockopt: TCP_CORK OFF failed.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/tangwz[P]Gogoing/src/Gogoing_util.cpp"
            ,0x13f,local_28);
    exit(-1);
  }
  return;
}

Assistant:

void going_set_off_tcp_cork(int sockfd)
 {
 	int off = 0;
 	int ret = setsockopt(sockfd, SOL_TCP, TCP_CORK, &off, sizeof(off));
 	if(ret < 0){
 		log_err("setsockopt: TCP_CORK OFF failed.");
		exit(-1);
 	}
 }